

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O3

void prepare_keyvalue(char *keyvalue)

{
  size_t sVar1;
  ulong uVar2;
  uint uVar3;
  
  sVar1 = strlen(keyvalue);
  if ((*keyvalue == '\'') && (keyvalue[(int)sVar1 + -1] == '\'')) {
    uVar3 = (int)sVar1 - 2;
    if (0 < (int)uVar3) {
      memmove(keyvalue,keyvalue + 1,(ulong)uVar3);
    }
    keyvalue[(int)uVar3] = '\0';
  }
  sVar1 = strlen(keyvalue);
  uVar3 = (int)sVar1 - 1;
  if ((int)uVar3 < 1) {
    uVar2 = 0;
LAB_00176845:
    if (-1 < (int)uVar3 && (uint)uVar2 != uVar3) {
      do {
        uVar3 = (int)sVar1 - 1;
        sVar1 = (size_t)uVar3;
        if (keyvalue[sVar1] != ' ') {
          return;
        }
        keyvalue[sVar1] = '\0';
      } while (0 < (int)uVar3);
    }
  }
  else {
    uVar2 = 0;
    do {
      if (keyvalue[uVar2] != ' ') goto LAB_00176845;
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  return;
}

Assistant:

void prepare_keyvalue(char *keyvalue) /* string containing keyword value     */

/*
  strip off all single quote characters "'" and blank spaces from a keyword
  value retrieved via fits_read_key*() routines

  this is necessary so that a standard comparision of keyword values may
  be made
*/

{

  int i;
  int length;

  /*
    strip off any leading or trailing single quotes (`) and (') from
    the keyword value
  */

  length = strlen(keyvalue) - 1;

  if(keyvalue[0] == '\'' && keyvalue[length] == '\'')
    {
      for(i = 0; i < length - 1; ++i) keyvalue[i] = keyvalue[i+1];
      keyvalue[length-1] = 0;
    }
  
  /*
    strip off any trailing blanks from the keyword value; note that if the
    keyvalue consists of nothing but blanks then no blanks are stripped
  */

  length = strlen(keyvalue) - 1;

  for(i = 0; i < length && keyvalue[i] == ' '; ++i);

  if(i != length)
    {
      for(i = length; i >= 0 && keyvalue[i] == ' '; --i) keyvalue[i] = '\0';
    }
}